

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

size_t __thiscall
merlin::graphical_model::induced_width(graphical_model *this,variable_order_t *order)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  pointer pvVar4;
  pointer peVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  pointer puVar8;
  long lVar9;
  size_t n;
  unsigned_long uVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer peVar13;
  index i;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  size_t j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  my_set<merlin::edge_id> ns;
  graph g;
  ulong local_1a0;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_188;
  index local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  allocator_type local_150 [8];
  _Rb_tree_node_base local_148;
  ulong local_128;
  my_set<merlin::edge_id> local_120;
  graph local_100;
  
  mrf(&local_188,this);
  puVar1 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  n = (long)puVar2 - (long)puVar1 >> 3;
  graph::graph(&local_100,n);
  if (local_188.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_188.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    i = 0;
    pvVar4 = local_188.
             super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pvVar12 = local_188.
              super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar8 = pvVar12[i].m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pvVar12[i].m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar8) {
        pvVar11 = pvVar12 + i;
        lVar9 = 0;
        do {
          graph::add_edge(&local_100,i,puVar8[lVar9]);
          lVar9 = lVar9 + 1;
          puVar8 = (pvVar11->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pvVar4 = local_188.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar12 = local_188.
                    super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (lVar9 != (long)(pvVar11->m_v).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3);
      }
      i = i + 1;
    } while (i < (ulong)(((long)pvVar4 - (long)pvVar12 >> 3) * 0x6db6db6db6db6db7));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_168,n,local_150);
  if (puVar2 != puVar1) {
    puVar8 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[puVar8[uVar10]] = uVar10;
      uVar10 = uVar10 + 1;
    } while (n + (n == 0) != uVar10);
    if (puVar2 != puVar1) {
      lVar9 = 0;
      local_1a0 = 0;
      do {
        uVar10 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        uVar3 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        my_set<merlin::edge_id>::my_set
                  (&local_120,
                   local_100.m_adj.
                   super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10);
        local_148._M_color = _S_red;
        local_148._M_parent = (_Base_ptr)0x0;
        local_128 = 0;
        peVar5 = local_120.super_my_vector<merlin::edge_id>.
                 super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                 super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        peVar13 = local_120.super_my_vector<merlin::edge_id>.
                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_148._M_left = &local_148;
        local_148._M_right = &local_148;
        if (local_120.super_my_vector<merlin::edge_id>.
            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_120.super_my_vector<merlin::edge_id>.
            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            local_170 = peVar13->second;
            if (uVar3 < local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_170]) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)local_150,&local_170);
              peVar5 = local_120.super_my_vector<merlin::edge_id>.
                       super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                       super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            }
            peVar13 = peVar13 + 1;
          } while (peVar13 != peVar5);
          p_Var7 = local_148._M_left;
          if (local_1a0 <= local_128) {
            local_1a0 = local_128;
          }
          for (; p_Var7 != &local_148;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            for (p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
                p_Var6 != &local_148; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)
                ) {
              if (*(index *)(p_Var7 + 1) != *(index *)(p_Var6 + 1)) {
                graph::add_edge(&local_100,*(index *)(p_Var7 + 1),*(index *)(p_Var6 + 1));
              }
            }
          }
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)local_150);
        if (local_120.super_my_vector<merlin::edge_id>.
            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.super_my_vector<merlin::edge_id>.
                          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != n + (n == 0));
      goto LAB_0012e6dc;
    }
  }
  local_1a0 = 0;
LAB_0012e6dc:
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  graph::~graph(&local_100);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_188);
  return local_1a0;
}

Assistant:

size_t induced_width(const variable_order_t& order) const {
		//return pseudo_tree_size(order).first;

		size_t width = 0;
		std::vector<variable_set> adj = mrf();
		size_t n = order.size();
		graph g(n); // create the graph
		for (size_t i = 0; i < adj.size(); ++i) {
			const variable_set& vi = adj[i];
			for (variable_set::const_iterator cj = vi.begin();
					cj != vi.end(); ++cj) {
				size_t j = _vindex(*cj);
				g.add_edge(i, j);
			}
		}

		std::vector<size_t> position(n);
		for (size_t i = 0; i < n; ++i) {
			position[order[i]] = i;
		}

		// eliminate variables and create induced edges
		for (size_t i = 0; i < n; ++i) {
			size_t var = order[i];
			size_t pos = position[var];

			// find the neighbors appearing later in the ordering
			const my_set<edge_id> ns = g.neighbors(var);
			std::set<size_t> S;
			for (my_set<edge_id>::const_iterator si = ns.begin();
					si != ns.end(); ++si) {
				size_t j = si->second;
				if (position[j] > pos) {
					S.insert(j);
				}
			}

			// connect the neighbors appearing later in the ordering
			width = std::max(width, S.size());
			std::set<size_t>::iterator it1, it2;
			for (it1 = S.begin(); it1 != S.end(); ++it1) {
				it2 = it1;
				while (++it2 != S.end()) {
					size_t u = *it1, v = *it2;
					if (u != v) g.add_edge(u, v);
				}
			}
		}

		return width;
	}